

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

int luaV_tonumber_(TValue *obj,lua_Number *n)

{
  int iVar1;
  Value local_38;
  Value local_30;
  TValue v;
  lua_Number *n_local;
  TValue *obj_local;
  
  v._8_8_ = n;
  if (obj->tt_ == 0x13) {
    if (obj->tt_ != 0x13) {
      __assert_fail("((((obj))->tt_) == (((3) | ((1) << 4))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x6a,"int luaV_tonumber_(const TValue *, lua_Number *)");
    }
    *n = (double)(obj->value_).i;
    obj_local._4_4_ = 1;
  }
  else {
    iVar1 = l_strton(obj,(TValue *)&local_30);
    if (iVar1 == 0) {
      obj_local._4_4_ = 0;
    }
    else {
      if ((v.value_.b._0_2_ & 0xf) != 3) {
        __assert_fail("(((((((&v))->tt_)) & 0x0F)) == (3))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x6e,"int luaV_tonumber_(const TValue *, lua_Number *)");
      }
      if (v.value_.b._0_2_ == 0x13) {
        local_38.n = (lua_Number)local_30.i;
      }
      else {
        if (v.value_.b._0_2_ != 3) {
          __assert_fail("((((&v))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x6e,"int luaV_tonumber_(const TValue *, lua_Number *)");
        }
        local_38.gc = local_30.gc;
      }
      *(Value *)v._8_8_ = local_38;
      obj_local._4_4_ = 1;
    }
  }
  return obj_local._4_4_;
}

Assistant:

int luaV_tonumber_ (const TValue *obj, lua_Number *n) {
  TValue v;
  if (ttisinteger(obj)) {
    *n = cast_num(ivalue(obj));
    return 1;
  }
  else if (l_strton(obj, &v)) {  /* string coercible to number? */
    *n = nvalue(&v);  /* convert result of 'luaO_str2num' to a float */
    return 1;
  }
  else
    return 0;  /* conversion failed */
}